

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O3

void refs_free(refs_t *r)

{
  int iVar1;
  ref_entry *__ptr;
  khint_t kVar2;
  byte bVar3;
  uint uVar4;
  kh_refs_t *__ptr_00;
  
  iVar1 = r->count;
  r->count = iVar1 + -1;
  if (r != (refs_t *)0x0 && iVar1 < 2) {
    if (r->pool != (string_alloc_t *)0x0) {
      string_pool_destroy(r->pool);
    }
    __ptr_00 = r->h_meta;
    if (__ptr_00 != (kh_refs_t *)0x0) {
      kVar2 = __ptr_00->n_buckets;
      if (kVar2 != 0) {
        bVar3 = 0;
        uVar4 = 0;
        do {
          if (((__ptr_00->flags[uVar4 >> 4] >> (bVar3 & 0x1e) & 3) == 0) &&
             (__ptr = __ptr_00->vals[uVar4], __ptr != (ref_entry *)0x0)) {
            if (__ptr->seq != (char *)0x0) {
              free(__ptr->seq);
            }
            free(__ptr);
            __ptr_00 = r->h_meta;
            kVar2 = __ptr_00->n_buckets;
          }
          uVar4 = uVar4 + 1;
          bVar3 = bVar3 + 2;
        } while (uVar4 != kVar2);
      }
      free(__ptr_00->keys);
      free(__ptr_00->flags);
      free(__ptr_00->vals);
      free(__ptr_00);
    }
    if (r->ref_id != (ref_entry **)0x0) {
      free(r->ref_id);
    }
    if (r->fp != (BGZF *)0x0) {
      bgzf_close(r->fp);
    }
    pthread_mutex_destroy((pthread_mutex_t *)&r->lock);
    free(r);
    return;
  }
  return;
}

Assistant:

void refs_free(refs_t *r) {
    RP("refs_free()\n");

    if (--r->count > 0)
	return;

    if (!r)
	return;

    if (r->pool)
	string_pool_destroy(r->pool);

    if (r->h_meta) {
	khint_t k;

	for (k = kh_begin(r->h_meta); k != kh_end(r->h_meta); k++) {
	    ref_entry *e;

	    if (!kh_exist(r->h_meta, k))
		continue;
	    if (!(e = kh_val(r->h_meta, k)))
		continue;
	    if (e->seq)
		free(e->seq);
	    free(e);
	}

	kh_destroy(refs, r->h_meta);
    }
    
    if (r->ref_id)
	free(r->ref_id);

    if (r->fp)
	bgzf_close(r->fp);

    pthread_mutex_destroy(&r->lock);

    free(r);
}